

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

void ghc::filesystem::detail::appendUTF8(string *str,uint32_t unicode)

{
  uint uVar1;
  char cVar2;
  
  while (cVar2 = (char)str, 0x7f < unicode) {
    if (unicode < 0x800) goto LAB_00151b46;
    if ((unicode < 0xd800) || ((unicode & 0xffffe000) == 0xe000)) goto LAB_00151b31;
    uVar1 = unicode - 0x10000;
    unicode = 0xfffd;
    if (uVar1 < 0x100000) goto code_r0x00151b00;
  }
LAB_00151b59:
  std::__cxx11::string::push_back(cVar2);
  return;
code_r0x00151b00:
  std::__cxx11::string::push_back(cVar2);
LAB_00151b31:
  std::__cxx11::string::push_back(cVar2);
LAB_00151b46:
  std::__cxx11::string::push_back(cVar2);
  goto LAB_00151b59;
}

Assistant:

GHC_INLINE void appendUTF8(std::string& str, uint32_t unicode)
{
    if (unicode <= 0x7f) {
        str.push_back(static_cast<char>(unicode));
    }
    else if (unicode >= 0x80 && unicode <= 0x7ff) {
        str.push_back(static_cast<char>((unicode >> 6) + 192));
        str.push_back(static_cast<char>((unicode & 0x3f) + 128));
    }
    else if ((unicode >= 0x800 && unicode <= 0xd7ff) || (unicode >= 0xe000 && unicode <= 0xffff)) {
        str.push_back(static_cast<char>((unicode >> 12) + 224));
        str.push_back(static_cast<char>(((unicode & 0xfff) >> 6) + 128));
        str.push_back(static_cast<char>((unicode & 0x3f) + 128));
    }
    else if (unicode >= 0x10000 && unicode <= 0x10ffff) {
        str.push_back(static_cast<char>((unicode >> 18) + 240));
        str.push_back(static_cast<char>(((unicode & 0x3ffff) >> 12) + 128));
        str.push_back(static_cast<char>(((unicode & 0xfff) >> 6) + 128));
        str.push_back(static_cast<char>((unicode & 0x3f) + 128));
    }
    else {
#ifdef GHC_RAISE_UNICODE_ERRORS
        throw filesystem_error("Illegal code point for unicode character.", str, std::make_error_code(std::errc::illegal_byte_sequence));
#else
        appendUTF8(str, 0xfffd);
#endif
    }
}